

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::MVNParameter::ByteSizeLong(MVNParameter *this)

{
  bool bVar1;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  MVNParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = MVNParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    bVar1 = has_across_channels(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
    bVar1 = has_normalize_variance(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
    bVar1 = has_eps(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 5;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar2;
  return sStack_38;
}

Assistant:

size_t MVNParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.MVNParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 7u) {
    // optional bool across_channels = 2 [default = false];
    if (has_across_channels()) {
      total_size += 1 + 1;
    }

    // optional bool normalize_variance = 1 [default = true];
    if (has_normalize_variance()) {
      total_size += 1 + 1;
    }

    // optional float eps = 3 [default = 1e-09];
    if (has_eps()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}